

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core_sse2.cc
# Opt level: O0

void webrtc::OverdriveAndSuppressSSE2(AecCore *aec,float *hNl,float hNlFb,float (*efw) [65])

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  undefined8 extraout_XMM0_Qb;
  undefined8 in_XMM3_Qa;
  __m128 afVar6;
  __m128 b;
  undefined8 uStack_3b8;
  __m128 vec_efw_im;
  __m128 vec_efw_re;
  __m128 vec_overDriveSm_overDriveCurve;
  __m128 vec_overDriveCurve;
  __m128 vec_if1;
  __m128 vec_if0;
  __m128 vec_one_weightCurve_hNl;
  __m128 vec_one_weightCurve;
  __m128 vec_weightCurve_hNlFb;
  __m128 bigger;
  __m128 vec_weightCurve;
  __m128 vec_hNl;
  __m128 vec_overDriveSm;
  __m128 vec_minus_one;
  __m128 vec_one;
  __m128 vec_hNlFb;
  int i;
  float (*efw_local) [65];
  float hNlFb_local;
  float *hNl_local;
  AecCore *aec_local;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float local_1b8;
  float fStack_1b4;
  float local_78;
  float fStack_74;
  
  fVar5 = aec->overDriveSm;
  for (vec_hNlFb[3] = 0.0; (int)vec_hNlFb[3] + 3 < 0x41;
      vec_hNlFb[3] = (float)((int)vec_hNlFb[3] + 4)) {
    local_78 = (float)*(undefined8 *)(hNl + (int)vec_hNlFb[3]);
    fStack_74 = (float)((ulong)*(undefined8 *)(hNl + (int)vec_hNlFb[3]) >> 0x20);
    local_1b8 = (float)*(undefined8 *)(WebRtcAec_weightCurve + (long)(int)vec_hNlFb[3] * 4);
    fStack_1b4 = (float)((ulong)*(undefined8 *)(WebRtcAec_weightCurve + (long)(int)vec_hNlFb[3] * 4)
                        >> 0x20);
    b[1] = fStack_1b4 * hNlFb;
    b[0] = local_1b8 * hNlFb;
    afVar6._0_8_ = CONCAT44((-(uint)(hNlFb < fStack_74) ^ 0xffffffff) & (uint)fStack_74,
                            (-(uint)(hNlFb < local_78) ^ 0xffffffff) & (uint)local_78) |
                   CONCAT44(-(uint)(hNlFb < fStack_74),-(uint)(hNlFb < local_78)) &
                   CONCAT44(fStack_1b4 * hNlFb + (1.0 - fStack_1b4) * fStack_74,
                            local_1b8 * hNlFb + (1.0 - local_1b8) * local_78);
    local_208 = (float)*(undefined8 *)(WebRtcAec_overDriveCurve + (long)(int)vec_hNlFb[3] * 4);
    fStack_204 = (float)((ulong)*(undefined8 *)
                                 (WebRtcAec_overDriveCurve + (long)(int)vec_hNlFb[3] * 4) >> 0x20);
    afVar6[3] = fVar5 * fStack_204;
    afVar6[2] = fVar5 * local_208;
    b[2] = (float)(int)in_XMM3_Qa;
    b[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
    afVar6 = mm_pow_ps(afVar6,b);
    *(long *)(hNl + (int)vec_hNlFb[3]) = afVar6._0_8_;
    *(undefined8 *)(hNl + (int)vec_hNlFb[3] + 2) = extraout_XMM0_Qb;
    uVar1 = *(undefined8 *)(*efw + (int)vec_hNlFb[3]);
    uVar2 = *(undefined8 *)(*efw + (int)vec_hNlFb[3] + 2);
    uVar3 = *(undefined8 *)(efw[1] + (int)vec_hNlFb[3]);
    uVar4 = *(undefined8 *)(efw[1] + (int)vec_hNlFb[3] + 2);
    local_218 = (float)uVar1;
    fStack_214 = (float)((ulong)uVar1 >> 0x20);
    fStack_210 = (float)uVar2;
    fStack_20c = (float)((ulong)uVar2 >> 0x20);
    local_228 = afVar6[0];
    fStack_224 = afVar6[1];
    fStack_220 = (float)extraout_XMM0_Qb;
    fStack_21c = (float)((ulong)extraout_XMM0_Qb >> 0x20);
    vec_efw_im[3] = fStack_214 * fStack_224;
    vec_efw_im[2] = local_218 * local_228;
    vec_efw_re[1] = fStack_20c * fStack_21c;
    vec_efw_re[0] = fStack_210 * fStack_220;
    local_238 = (float)uVar3;
    fStack_234 = (float)((ulong)uVar3 >> 0x20);
    fStack_230 = (float)uVar4;
    fStack_22c = (float)((ulong)uVar4 >> 0x20);
    uStack_3b8 = CONCAT44(fStack_234 * fStack_224 * -1.0,local_238 * local_228 * -1.0);
    vec_efw_im[1] = fStack_22c * fStack_21c * -1.0;
    vec_efw_im[0] = fStack_230 * fStack_220 * -1.0;
    *(undefined8 *)(*efw + (int)vec_hNlFb[3]) = vec_efw_im._8_8_;
    *(undefined8 *)(*efw + (int)vec_hNlFb[3] + 2) = vec_efw_re._0_8_;
    *(undefined8 *)(efw[1] + (int)vec_hNlFb[3]) = uStack_3b8;
    *(undefined8 *)(efw[1] + (int)vec_hNlFb[3] + 2) = vec_efw_im._0_8_;
  }
  for (; (int)vec_hNlFb[3] < 0x41; vec_hNlFb[3] = (float)((int)vec_hNlFb[3] + 1)) {
    if (hNlFb < hNl[(int)vec_hNlFb[3]]) {
      hNl[(int)vec_hNlFb[3]] =
           *(float *)(WebRtcAec_weightCurve + (long)(int)vec_hNlFb[3] * 4) * hNlFb +
           (1.0 - *(float *)(WebRtcAec_weightCurve + (long)(int)vec_hNlFb[3] * 4)) *
           hNl[(int)vec_hNlFb[3]];
    }
    fVar5 = powf(hNl[(int)vec_hNlFb[3]],
                 aec->overDriveSm *
                 *(float *)(WebRtcAec_overDriveCurve + (long)(int)vec_hNlFb[3] * 4));
    hNl[(int)vec_hNlFb[3]] = fVar5;
    (*efw)[(int)vec_hNlFb[3]] = hNl[(int)vec_hNlFb[3]] * (*efw)[(int)vec_hNlFb[3]];
    efw[1][(int)vec_hNlFb[3]] = hNl[(int)vec_hNlFb[3]] * efw[1][(int)vec_hNlFb[3]];
    efw[1][(int)vec_hNlFb[3]] = efw[1][(int)vec_hNlFb[3]] * -1.0;
  }
  return;
}

Assistant:

static void OverdriveAndSuppressSSE2(AecCore* aec,
                                     float hNl[PART_LEN1],
                                     const float hNlFb,
                                     float efw[2][PART_LEN1]) {
  int i;
  const __m128 vec_hNlFb = _mm_set1_ps(hNlFb);
  const __m128 vec_one = _mm_set1_ps(1.0f);
  const __m128 vec_minus_one = _mm_set1_ps(-1.0f);
  const __m128 vec_overDriveSm = _mm_set1_ps(aec->overDriveSm);
  // vectorized code (four at once)
  for (i = 0; i + 3 < PART_LEN1; i += 4) {
    // Weight subbands
    __m128 vec_hNl = _mm_loadu_ps(&hNl[i]);
    const __m128 vec_weightCurve = _mm_loadu_ps(&WebRtcAec_weightCurve[i]);
    const __m128 bigger = _mm_cmpgt_ps(vec_hNl, vec_hNlFb);
    const __m128 vec_weightCurve_hNlFb = _mm_mul_ps(vec_weightCurve, vec_hNlFb);
    const __m128 vec_one_weightCurve = _mm_sub_ps(vec_one, vec_weightCurve);
    const __m128 vec_one_weightCurve_hNl =
        _mm_mul_ps(vec_one_weightCurve, vec_hNl);
    const __m128 vec_if0 = _mm_andnot_ps(bigger, vec_hNl);
    const __m128 vec_if1 = _mm_and_ps(
        bigger, _mm_add_ps(vec_weightCurve_hNlFb, vec_one_weightCurve_hNl));
    vec_hNl = _mm_or_ps(vec_if0, vec_if1);

    {
      const __m128 vec_overDriveCurve =
          _mm_loadu_ps(&WebRtcAec_overDriveCurve[i]);
      const __m128 vec_overDriveSm_overDriveCurve =
          _mm_mul_ps(vec_overDriveSm, vec_overDriveCurve);
      vec_hNl = mm_pow_ps(vec_hNl, vec_overDriveSm_overDriveCurve);
      _mm_storeu_ps(&hNl[i], vec_hNl);
    }

    // Suppress error signal
    {
      __m128 vec_efw_re = _mm_loadu_ps(&efw[0][i]);
      __m128 vec_efw_im = _mm_loadu_ps(&efw[1][i]);
      vec_efw_re = _mm_mul_ps(vec_efw_re, vec_hNl);
      vec_efw_im = _mm_mul_ps(vec_efw_im, vec_hNl);

      // Ooura fft returns incorrect sign on imaginary component. It matters
      // here because we are making an additive change with comfort noise.
      vec_efw_im = _mm_mul_ps(vec_efw_im, vec_minus_one);
      _mm_storeu_ps(&efw[0][i], vec_efw_re);
      _mm_storeu_ps(&efw[1][i], vec_efw_im);
    }
  }
  // scalar code for the remaining items.
  for (; i < PART_LEN1; i++) {
    // Weight subbands
    if (hNl[i] > hNlFb) {
      hNl[i] = WebRtcAec_weightCurve[i] * hNlFb +
               (1 - WebRtcAec_weightCurve[i]) * hNl[i];
    }
    hNl[i] = powf(hNl[i], aec->overDriveSm * WebRtcAec_overDriveCurve[i]);

    // Suppress error signal
    efw[0][i] *= hNl[i];
    efw[1][i] *= hNl[i];

    // Ooura fft returns incorrect sign on imaginary component. It matters
    // here because we are making an additive change with comfort noise.
    efw[1][i] *= -1;
  }
}